

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

void __thiscall
spvtools::opt::analysis::Image::Image
          (Image *this,Type *type,Dim dimen,uint32_t d,bool array,bool multisample,uint32_t sampling
          ,ImageFormat f,AccessQualifier qualifier)

{
  uint32_t in_stack_00000008;
  
  (this->super_Type).decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Type).decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Type).decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Type).kind_ = kImage;
  (this->super_Type)._vptr_Type = (_func_int **)&PTR__Type_003b0890;
  this->sampled_type_ = type;
  this->dim_ = dimen;
  this->depth_ = d;
  this->arrayed_ = array;
  this->ms_ = multisample;
  this->sampled_ = in_stack_00000008;
  this->format_ = sampling;
  this->access_qualifier_ = f;
  return;
}

Assistant:

Image::Image(Type* type, spv::Dim dimen, uint32_t d, bool array,
             bool multisample, uint32_t sampling, spv::ImageFormat f,
             spv::AccessQualifier qualifier)
    : Type(kImage),
      sampled_type_(type),
      dim_(dimen),
      depth_(d),
      arrayed_(array),
      ms_(multisample),
      sampled_(sampling),
      format_(f),
      access_qualifier_(qualifier) {
  // TODO(antiagainst): check sampled_type
}